

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

bool __thiscall crnlib::mipmapped_texture::flip_y_helper(mipmapped_texture *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  long in_RDI;
  uint m;
  uint l;
  uint uVar5;
  uint local_18;
  uint local_14;
  
  local_14 = 0;
  do {
    uVar5 = local_14;
    uVar2 = vector<crnlib::vector<crnlib::mip_level_*>_>::size
                      ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20));
    if (uVar2 <= uVar5) {
      return true;
    }
    local_18 = 0;
    while( true ) {
      uVar2 = local_18;
      pvVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),local_14);
      uVar3 = vector<crnlib::mip_level_*>::size(pvVar4);
      if (uVar3 <= uVar2) break;
      pvVar4 = vector<crnlib::vector<crnlib::mip_level_*>_>::operator[]
                         ((vector<crnlib::vector<crnlib::mip_level_*>_> *)(in_RDI + 0x20),local_14);
      vector<crnlib::mip_level_*>::operator[](pvVar4,local_18);
      bVar1 = mip_level::flip_y((mip_level *)CONCAT44(uVar5,uVar2));
      if (!bVar1) {
        return false;
      }
      local_18 = local_18 + 1;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

bool mipmapped_texture::flip_y_helper() {
  for (uint l = 0; l < m_faces.size(); l++)
    for (uint m = 0; m < m_faces[l].size(); m++)
      if (!m_faces[l][m]->flip_y())
        return false;

  return true;
}